

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

Solver * __thiscall
despot::PlannerBase::InitializeSolver
          (PlannerBase *this,DSPOMDP *model,Belief *belief,string *solver_type,Option *options)

{
  POMCPPrior *pPVar1;
  ScenarioUpperBound *pSVar2;
  ScenarioLowerBound *pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DESPOT *this_00;
  ScenarioBaselineSolver *this_01;
  BeliefLowerBound *lower_bound_00;
  BeliefUpperBound *upper_bound_00;
  AEMS *this_02;
  BeliefBaselineSolver *this_03;
  Option *pOVar6;
  undefined4 extraout_var_03;
  log_ostream *plVar7;
  char *pcVar8;
  POMCP *this_04;
  DPOMCP *this_05;
  ostream *poVar9;
  char *local_440;
  char *local_3e0;
  char *local_380;
  char *local_320;
  char *local_300;
  char *local_2a0;
  char *local_280;
  string local_268 [32];
  POMCPPrior *local_248;
  POMCPPrior *prior;
  string local_238 [8];
  string ptype;
  BeliefUpperBound *upper_bound_1;
  string local_1e8 [8];
  string ubtype_1;
  BeliefLowerBound *lower_bound_1;
  string local_198 [8];
  string lbtype_1;
  string local_158 [32];
  ScenarioUpperBound *local_138;
  ScenarioUpperBound *upper_bound;
  string local_128 [8];
  string ubtype;
  string local_100 [8];
  string bubtype;
  string local_c0 [32];
  ScenarioLowerBound *local_a0;
  ScenarioLowerBound *lower_bound;
  string local_90 [8];
  string lbtype;
  allocator<char> local_59;
  string local_58 [8];
  string blbtype;
  Solver *solver;
  Option *options_local;
  string *solver_type_local;
  Belief *belief_local;
  DSPOMDP *model_local;
  PlannerBase *this_local;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  blbtype.field_2._8_8_ = 0;
  bVar4 = std::operator==(solver_type,"DESPOT");
  if ((bVar4) || (bVar4 = std::operator==(solver_type,"PLB"), bVar4)) {
    pOVar6 = option::Option::operator_cast_to_Option_(options + 0x12);
    if (pOVar6 == (Option *)0x0) {
      local_280 = "DEFAULT";
    }
    else {
      local_280 = options[0x12].arg;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,local_280,&local_59);
    std::allocator<char>::~allocator(&local_59);
    pOVar6 = option::Option::operator_cast_to_Option_(options + 0x13);
    if (pOVar6 == (Option *)0x0) {
      local_2a0 = "DEFAULT";
    }
    else {
      local_2a0 = options[0x13].arg;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,local_2a0,(allocator<char> *)((long)&lower_bound + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound + 7));
    std::__cxx11::string::string(local_c0,local_90);
    std::__cxx11::string::string((string *)(bubtype.field_2._M_local_buf + 8),local_58);
    iVar5 = (*model->_vptr_DSPOMDP[0xf])(model,local_c0,(undefined1 *)((long)&bubtype.field_2 + 8));
    std::__cxx11::string::~string((string *)(bubtype.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_c0);
    local_a0 = (ScenarioLowerBound *)CONCAT44(extraout_var,iVar5);
    iVar5 = logging::level();
    if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
      plVar7 = logging::stream(3);
      poVar9 = std::operator<<(&plVar7->super_ostream,"Created lower bound ");
      pSVar3 = local_a0;
      if (local_a0 == (ScenarioLowerBound *)0x0) {
        __cxa_bad_typeid();
      }
      pcVar8 = std::type_info::name((type_info *)pSVar3->_vptr_ScenarioLowerBound[-1]);
      poVar9 = std::operator<<(poVar9,pcVar8);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    bVar4 = std::operator==(solver_type,"DESPOT");
    if (bVar4) {
      pOVar6 = option::Option::operator_cast_to_Option_(options + 0x14);
      if (pOVar6 == (Option *)0x0) {
        local_300 = "DEFAULT";
      }
      else {
        local_300 = options[0x14].arg;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,local_300,(allocator<char> *)(ubtype.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(ubtype.field_2._M_local_buf + 0xf));
      pOVar6 = option::Option::operator_cast_to_Option_(options + 0x15);
      if (pOVar6 == (Option *)0x0) {
        local_320 = "DEFAULT";
      }
      else {
        local_320 = options[0x15].arg;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_128,local_320,(allocator<char> *)((long)&upper_bound + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&upper_bound + 7));
      std::__cxx11::string::string(local_158,local_128);
      std::__cxx11::string::string((string *)(lbtype_1.field_2._M_local_buf + 8),local_100);
      iVar5 = (*model->_vptr_DSPOMDP[0xd])
                        (model,local_158,(undefined1 *)((long)&lbtype_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(lbtype_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string(local_158);
      local_138 = (ScenarioUpperBound *)CONCAT44(extraout_var_00,iVar5);
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
        plVar7 = logging::stream(3);
        poVar9 = std::operator<<(&plVar7->super_ostream,"Created upper bound ");
        pSVar2 = local_138;
        if (local_138 == (ScenarioUpperBound *)0x0) {
          __cxa_bad_typeid();
        }
        pcVar8 = std::type_info::name((type_info *)pSVar2->_vptr_ScenarioUpperBound[-1]);
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      this_00 = (DESPOT *)operator_new(0xc0);
      DESPOT::DESPOT(this_00,model,local_a0,local_138,(Belief *)0x0);
      blbtype.field_2._8_8_ = this_00;
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_100);
    }
    else {
      this_01 = (ScenarioBaselineSolver *)operator_new(0x50);
      ScenarioBaselineSolver::ScenarioBaselineSolver(this_01,local_a0,(Belief *)0x0);
      blbtype.field_2._8_8_ = this_01;
    }
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_58);
  }
  else {
    bVar4 = std::operator==(solver_type,"AEMS");
    if ((bVar4) || (bVar4 = std::operator==(solver_type,"BLB"), bVar4)) {
      pOVar6 = option::Option::operator_cast_to_Option_(options + 0x13);
      if (pOVar6 == (Option *)0x0) {
        local_380 = "DEFAULT";
      }
      else {
        local_380 = options[0x13].arg;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_198,local_380,(allocator<char> *)((long)&lower_bound_1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound_1 + 7));
      std::__cxx11::string::string((string *)(ubtype_1.field_2._M_local_buf + 8),local_198);
      iVar5 = (*model->_vptr_DSPOMDP[0x1a])(model,(undefined1 *)((long)&ubtype_1.field_2 + 8));
      lower_bound_00 = (BeliefLowerBound *)CONCAT44(extraout_var_01,iVar5);
      std::__cxx11::string::~string((string *)(ubtype_1.field_2._M_local_buf + 8));
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
        plVar7 = logging::stream(3);
        poVar9 = std::operator<<(&plVar7->super_ostream,"Created lower bound ");
        if (lower_bound_00 == (BeliefLowerBound *)0x0) {
          __cxa_bad_typeid();
        }
        pcVar8 = std::type_info::name((type_info *)lower_bound_00->_vptr_BeliefLowerBound[-1]);
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      bVar4 = std::operator==(solver_type,"AEMS");
      if (bVar4) {
        pOVar6 = option::Option::operator_cast_to_Option_(options + 0x15);
        if (pOVar6 == (Option *)0x0) {
          local_3e0 = "DEFAULT";
        }
        else {
          local_3e0 = options[0x15].arg;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1e8,local_3e0,(allocator<char> *)((long)&upper_bound_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&upper_bound_1 + 7));
        std::__cxx11::string::string((string *)(ptype.field_2._M_local_buf + 8),local_1e8);
        iVar5 = (*model->_vptr_DSPOMDP[0x1b])(model,(undefined1 *)((long)&ptype.field_2 + 8));
        upper_bound_00 = (BeliefUpperBound *)CONCAT44(extraout_var_02,iVar5);
        std::__cxx11::string::~string((string *)(ptype.field_2._M_local_buf + 8));
        iVar5 = logging::level();
        if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
          plVar7 = logging::stream(3);
          poVar9 = std::operator<<(&plVar7->super_ostream,"Created upper bound ");
          if (upper_bound_00 == (BeliefUpperBound *)0x0) {
            __cxa_bad_typeid();
          }
          pcVar8 = std::type_info::name((type_info *)upper_bound_00->_vptr_BeliefUpperBound[-1]);
          poVar9 = std::operator<<(poVar9,pcVar8);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        this_02 = (AEMS *)operator_new(0xd0);
        AEMS::AEMS(this_02,model,lower_bound_00,upper_bound_00,(Belief *)0x0);
        blbtype.field_2._8_8_ = this_02;
        std::__cxx11::string::~string(local_1e8);
      }
      else {
        this_03 = (BeliefBaselineSolver *)operator_new(0x50);
        BeliefBaselineSolver::BeliefBaselineSolver(this_03,lower_bound_00,(Belief *)0x0);
        blbtype.field_2._8_8_ = this_03;
      }
      std::__cxx11::string::~string(local_198);
    }
    else {
      bVar4 = std::operator==(solver_type,"POMCP");
      if ((!bVar4) && (bVar4 = std::operator==(solver_type,"DPOMCP"), !bVar4)) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: Unsupported solver type: ");
        poVar9 = std::operator<<(poVar9,(string *)solver_type);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      pOVar6 = option::Option::operator_cast_to_Option_(options + 0x1e);
      if (pOVar6 == (Option *)0x0) {
        local_440 = "DEFAULT";
      }
      else {
        local_440 = options[0x1e].arg;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_238,local_440,(allocator<char> *)((long)&prior + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&prior + 7));
      std::__cxx11::string::string(local_268,local_238);
      iVar5 = (*model->_vptr_DSPOMDP[0x10])(model,local_268);
      std::__cxx11::string::~string(local_268);
      local_248 = (POMCPPrior *)CONCAT44(extraout_var_03,iVar5);
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 2 < iVar5)) {
        plVar7 = logging::stream(3);
        poVar9 = std::operator<<(&plVar7->super_ostream,"Created POMCP prior ");
        pPVar1 = local_248;
        if (local_248 == (POMCPPrior *)0x0) {
          __cxa_bad_typeid();
        }
        pcVar8 = std::type_info::name((type_info *)pPVar1->_vptr_POMCPPrior[-1]);
        poVar9 = std::operator<<(poVar9,pcVar8);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      pOVar6 = option::Option::operator_cast_to_Option_(options + 0xb);
      if (pOVar6 != (Option *)0x0) {
        POMCPPrior::exploration_constant(local_248,DAT_00278a80);
      }
      bVar4 = std::operator==(solver_type,"POMCP");
      if (bVar4) {
        this_04 = (POMCP *)operator_new(0x60);
        POMCP::POMCP(this_04,model,local_248,(Belief *)0x0);
        blbtype.field_2._8_8_ = this_04;
      }
      else {
        this_05 = (DPOMCP *)operator_new(0x60);
        DPOMCP::DPOMCP(this_05,model,local_248,(Belief *)0x0);
        blbtype.field_2._8_8_ = this_05;
      }
      std::__cxx11::string::~string(local_238);
    }
  }
  if (blbtype.field_2._8_8_ == 0) {
    __assert_fail("solver != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/plannerbase.cpp"
                  ,0xf3,
                  "Solver *despot::PlannerBase::InitializeSolver(DSPOMDP *, Belief *, string, option::Option *)"
                 );
  }
  (**(code **)(*(long *)blbtype.field_2._8_8_ + 0x20))(blbtype.field_2._8_8_,belief);
  return (Solver *)blbtype.field_2._8_8_;
}

Assistant:

Solver *PlannerBase::InitializeSolver(DSPOMDP *model, Belief* belief,
		string solver_type, option::Option *options) {
	Solver *solver = NULL;
	// DESPOT or its default policy
	if (solver_type == "DESPOT" || solver_type == "PLB") // PLB: particle lower bound
			{
		string blbtype =
				options[E_BLBTYPE] ? options[E_BLBTYPE].arg : "DEFAULT";
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		ScenarioLowerBound *lower_bound = model->CreateScenarioLowerBound(
				lbtype, blbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "DESPOT") {
			string bubtype =
					options[E_BUBTYPE] ? options[E_BUBTYPE].arg : "DEFAULT";
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			ScenarioUpperBound *upper_bound = model->CreateScenarioUpperBound(
					ubtype, bubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new DESPOT(model, lower_bound, upper_bound);
		} else
			solver = new ScenarioBaselineSolver(lower_bound);
	} // AEMS or its default policy
	else if (solver_type == "AEMS" || solver_type == "BLB") {
		string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
		BeliefLowerBound *lower_bound =
				static_cast<BeliefMDP *>(model)->CreateBeliefLowerBound(lbtype);

		logi << "Created lower bound " << typeid(*lower_bound).name() << endl;

		if (solver_type == "AEMS") {
			string ubtype =
					options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
			BeliefUpperBound *upper_bound =
					static_cast<BeliefMDP *>(model)->CreateBeliefUpperBound(
							ubtype);

			logi << "Created upper bound " << typeid(*upper_bound).name()
					<< endl;

			solver = new AEMS(model, lower_bound, upper_bound);
		} else
			solver = new BeliefBaselineSolver(lower_bound);
	} // POMCP or DPOMCP
	else if (solver_type == "POMCP" || solver_type == "DPOMCP") {
		string ptype = options[E_PRIOR] ? options[E_PRIOR].arg : "DEFAULT";
		POMCPPrior *prior = model->CreatePOMCPPrior(ptype);

		logi << "Created POMCP prior " << typeid(*prior).name() << endl;

		if (options[E_PRUNE]) {
			prior->exploration_constant(Globals::config.pruning_constant);
		}

		if (solver_type == "POMCP")
			solver = new POMCP(model, prior);
		else
			solver = new DPOMCP(model, prior);
	} else { // Unsupported solver
		cerr << "ERROR: Unsupported solver type: " << solver_type << endl;
		exit(1);
	}

	assert(solver != NULL);
	solver->belief(belief);

	return solver;
}